

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GenNativeStruct
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  bool bVar1;
  reference ppFVar2;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  FieldDef *local_b0;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_a0;
  const_iterator it;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  NativeName_abi_cxx11_(&local_88,this,struct_def);
  std::operator+(&local_68,"type ",&local_88);
  std::operator+(&local_48,&local_68," struct {\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  local_a0._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  ((long)&code_ptr_local[7].field_2 + 8));
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       ((long)&code_ptr_local[7].field_2 + 8));
    bVar1 = __gnu_cxx::operator!=
                      (&local_a0,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_a0);
    local_b0 = *ppFVar2;
    if (((local_b0->deprecated & 1U) == 0) &&
       (((bVar1 = IsScalar((local_b0->value).type.base_type), !bVar1 ||
         ((local_b0->value).type.enum_def == (EnumDef *)0x0)) ||
        ((((local_b0->value).type.enum_def)->is_union & 1U) == 0)))) {
      IdlNamer::Field_abi_cxx11_(&local_110,&this->namer_,local_b0);
      std::operator+(&local_f0,"\t",&local_110);
      std::operator+(&local_d0,&local_f0," ");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      bVar1 = FieldDef::IsScalarOptional(local_b0);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)local_28,"*");
      }
      NativeType_abi_cxx11_(&local_1b0,this,&(local_b0->value).type);
      std::operator+(&local_190,&local_1b0," `json:\"");
      std::operator+(&local_170,&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      std::operator+(&local_150,&local_170,"\"`");
      std::operator+(&local_130,&local_150,"\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_a0);
  }
  std::__cxx11::string::operator+=((string *)local_28,"}\n\n");
  if ((code_ptr_local[8].field_2._M_local_buf[0] & 1U) == 0) {
    GenNativeTablePack(this,(StructDef *)code_ptr_local,code);
    GenNativeTableUnPack(this,(StructDef *)code_ptr_local,code);
  }
  else {
    GenNativeStructPack(this,(StructDef *)code_ptr_local,code);
    GenNativeStructUnPack(this,(StructDef *)code_ptr_local,code);
  }
  return;
}

Assistant:

void GenNativeStruct(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += "type " + NativeName(struct_def) + " struct {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      if (IsScalar(field.value.type.base_type) &&
          field.value.type.enum_def != nullptr &&
          field.value.type.enum_def->is_union)
        continue;
      code += "\t" + namer_.Field(field) + " ";
      if (field.IsScalarOptional()) { code += "*"; }
      code += NativeType(field.value.type) + " `json:\"" + field.name + "\"`" +
              "\n";
    }
    code += "}\n\n";

    if (!struct_def.fixed) {
      GenNativeTablePack(struct_def, code_ptr);
      GenNativeTableUnPack(struct_def, code_ptr);
    } else {
      GenNativeStructPack(struct_def, code_ptr);
      GenNativeStructUnPack(struct_def, code_ptr);
    }
  }